

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O2

bool QTestResult::reportResult
               (bool success,void *lhs,void *rhs,_func_char_ptr_void_ptr *lhsFormatter,
               _func_char_ptr_void_ptr *rhsFormatter,char *lhsExpr,char *rhsExpr,
               ComparisonOperation op,char *file,int line,char *failureMessage)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *val2;
  long in_FS_OFFSET;
  _Head_base<0UL,_const_char_*,_false> local_1048;
  _Head_base<0UL,_const_char_*,_false> local_1040;
  char msg [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg[0] = '\0';
  if (lhsExpr == (char *)0x0) {
    qt_assert("lhsExpr",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2bd);
  }
  if (rhsExpr != (char *)0x0) {
    iVar3 = QTestLog::verboseLevel();
    if (1 < iVar3) {
      pcVar4 = macroNameForOp(op);
      snprintf(msg,0x1000,"%s(%s, %s)",pcVar4,lhsExpr,rhsExpr);
      QTestLog::info(msg,file,line);
    }
    if (success) {
      if (QTest::expectFailMode != 0) {
        pcVar4 = macroNameForOp(op);
        snprintf(msg,0x1000,"%s(%s, %s) returned TRUE unexpectedly.",pcVar4,lhsExpr,rhsExpr);
      }
      bVar2 = checkStatement(true,msg,file,line);
    }
    else {
      pcVar4 = (*lhsFormatter)(lhs);
      local_1040._M_head_impl = pcVar4;
      val2 = (*rhsFormatter)(rhs);
      local_1048._M_head_impl = val2;
      if (failureMessage == (char *)0x0) {
        failureMessage = failureMessageForOp(op);
      }
      formatFailMessage(msg,0x1000,failureMessage,pcVar4,val2,lhsExpr,rhsExpr,op);
      bVar2 = checkStatement(false,msg,file,line);
      std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
                ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_1048);
      std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
                ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)&local_1040);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar2;
    }
    __stack_chk_fail();
  }
  qt_assert("rhsExpr",
            "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
            ,0x2be);
}

Assistant:

bool QTestResult::reportResult(bool success, const void *lhs, const void *rhs,
                               const char *(*lhsFormatter)(const void*),
                               const char *(*rhsFormatter)(const void*),
                               const char *lhsExpr, const char *rhsExpr,
                               QTest::ComparisonOperation op, const char *file, int line,
                               const char *failureMessage)
{
    Q_DECL_UNINITIALIZED char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpr);
    QTEST_ASSERT(rhsExpr);

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s)", macroNameForOp(op), lhsExpr, rhsExpr);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s) returned TRUE unexpectedly.",
                          macroNameForOp(op), lhsExpr, rhsExpr);
        }
        return checkStatement(success, msg, file, line);
    }

    const std::unique_ptr<const char[]> lhsPtr{ lhsFormatter(lhs) };
    const std::unique_ptr<const char[]> rhsPtr{ rhsFormatter(rhs) };

    if (!failureMessage)
        failureMessage = failureMessageForOp(op);

    formatFailMessage(msg, maxMsgLen, failureMessage, lhsPtr.get(), rhsPtr.get(),
                      lhsExpr, rhsExpr, op);

    return checkStatement(success, msg, file, line);
}